

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O2

cbtVector3 operator*(cbtVector3 *v,cbtScalar *s)

{
  float fVar1;
  undefined1 auVar2 [12];
  cbtVector3 cVar3;
  
  fVar1 = *s;
  cVar3.m_floats[0] = fVar1 * (float)*(undefined8 *)v->m_floats;
  cVar3.m_floats[1] = fVar1 * (float)((ulong)*(undefined8 *)v->m_floats >> 0x20);
  auVar2._4_8_ = SUB128(ZEXT812(0),4);
  auVar2._0_4_ = fVar1 * v->m_floats[2];
  cVar3.m_floats._8_8_ = auVar2._0_8_;
  return (cbtVector3)cVar3.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3
operator*(const cbtVector3& v, const cbtScalar& s)
{
#if defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
	__m128 vs = _mm_load_ss(&s);  //	(S 0 0 0)
	vs = bt_pshufd_ps(vs, 0x80);  //	(S S S 0.0)
	return cbtVector3(_mm_mul_ps(v.mVec128, vs));
#elif defined(BT_USE_NEON)
	float32x4_t r = vmulq_n_f32(v.mVec128, s);
	return cbtVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return cbtVector3(v.m_floats[0] * s, v.m_floats[1] * s, v.m_floats[2] * s);
#endif
}